

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

LoopDescriptor * __thiscall spvtools::opt::IRContext::GetLoopDescriptor(IRContext *this,Function *f)

{
  _Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
  _Var1;
  pair<std::__detail::_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false,_false>,_bool>
  pVar2;
  Function *local_220;
  Function *local_218;
  LoopDescriptor local_210;
  LoopDescriptor local_118;
  
  local_220 = f;
  if ((this->valid_analyses_ & kAnalysisLoopAnalysis) == kAnalysisNone) {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>_>_>
    ::_M_deallocate_nodes
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>_>_>
                *)&this->loop_descriptors_,
               (__node_ptr)(this->loop_descriptors_)._M_h._M_before_begin._M_nxt);
    memset((this->loop_descriptors_)._M_h._M_buckets,0,
           (this->loop_descriptors_)._M_h._M_bucket_count << 3);
    (this->loop_descriptors_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (this->loop_descriptors_)._M_h._M_element_count = 0;
    *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisLoopAnalysis;
  }
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->loop_descriptors_)._M_h,&local_220);
  if (_Var1._M_cur == (__node_type *)0x0) {
    LoopDescriptor::LoopDescriptor(&local_118,this,local_220);
    local_218 = local_220;
    LoopDescriptor::LoopDescriptor(&local_210,&local_118);
    pVar2 = std::
            _Hashtable<spvtools::opt::Function_const*,std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>,std::allocator<std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Function_const*>,std::hash<spvtools::opt::Function_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<spvtools::opt::Function_const*,spvtools::opt::LoopDescriptor>>
                      ((_Hashtable<spvtools::opt::Function_const*,std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>,std::allocator<std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Function_const*>,std::hash<spvtools::opt::Function_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->loop_descriptors_,&local_218);
    _Var1._M_cur = (__node_type *)
                   pVar2.first.
                   super__Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
                   ._M_cur;
    LoopDescriptor::~LoopDescriptor(&local_210);
    LoopDescriptor::~LoopDescriptor(&local_118);
  }
  return (LoopDescriptor *)
         ((long)&((_Var1._M_cur)->
                 super__Hash_node_value<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>_>
                 ._M_storage._M_storage + 8);
}

Assistant:

LoopDescriptor* IRContext::GetLoopDescriptor(const Function* f) {
  if (!AreAnalysesValid(kAnalysisLoopAnalysis)) {
    ResetLoopAnalysis();
  }

  std::unordered_map<const Function*, LoopDescriptor>::iterator it =
      loop_descriptors_.find(f);
  if (it == loop_descriptors_.end()) {
    return &loop_descriptors_
                .emplace(std::make_pair(f, LoopDescriptor(this, f)))
                .first->second;
  }

  return &it->second;
}